

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O1

Status __thiscall
google::protobuf::anon_unknown_21::ValidateDescriptor(anon_unknown_21 *this,Descriptor *descriptor)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  FieldOptions *pFVar4;
  EnumValueDescriptor *pEVar5;
  long lVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  Rep *pRVar10;
  void **ppvVar11;
  EnumDescriptor *pEVar12;
  Nonnull<const_char_*> pcVar13;
  char *pcVar14;
  long lVar15;
  char *pcVar16;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *pRVar17;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *pRVar18;
  undefined1 *from_msg;
  Edition args_3;
  char *pcVar19;
  char *in_R9;
  bool bVar20;
  long lVar21;
  FieldOptions_FeatureSupport *p;
  undefined1 *puVar22;
  long v1;
  FieldDescriptor *this_00;
  basic_string_view<char,_std::char_traits<char>_> args_1;
  basic_string_view<char,_std::char_traits<char>_> args_1_00;
  string_view full_name;
  basic_string_view<char,_std::char_traits<char>_> args_1_01;
  string_view full_name_00;
  basic_string_view<char,_std::char_traits<char>_> args_1_02;
  basic_string_view<char,_std::char_traits<char>_> args_1_03;
  basic_string_view<char,_std::char_traits<char>_> args_3_00;
  FeatureSupport support;
  FieldOptions_FeatureSupport local_60;
  
  if (descriptor->oneof_decl_count_ < 1) {
    bVar20 = 0 < descriptor->field_count_;
    if (0 < descriptor->field_count_) {
      lVar15 = 0;
      do {
        this_00 = descriptor->fields_ + lVar15;
        bVar7 = FieldDescriptor::is_required(this_00);
        if (bVar7) goto LAB_001e7dce;
        bVar1 = this_00->field_0x1;
        bVar7 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 == bVar7) {
          pcVar13 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar7,0xbf < bVar1,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar13 != (Nonnull<const_char_*>)0x0) {
          _GLOBAL__N_1::ValidateDescriptor();
LAB_001e7e4f:
          internal::protobuf_assumption_failed
                    ("!value || _impl_.feature_support_ != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                     ,0x49b9);
        }
        if (((this_00->field_0x1 & 0x20) != 0) ||
           (((this_00->type_ != '\x0e' && (this_00->type_ != '\b')) ||
            (iVar8 = internal::SooRep::size
                               (&(this_00->options_->field_0)._impl_.targets_.soo_rep_,
                                (*(byte *)((long)&this_00->options_->field_0 + 0x20) & 4) == 0),
            iVar8 == 0)))) {
LAB_001e7dce:
          pcVar14 = (this_00->all_names_).payload_;
          uVar2 = *(ushort *)(pcVar14 + 2);
          args_1_03._M_str._0_2_ = uVar2;
          args_1_03._M_len = (size_t)"Feature field ";
          args_1_03._M_str._2_6_ = 0;
          (anonymous_namespace)::
          Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                    ((char *)this,args_1_03,pcVar14 + ~(ulong)uVar2);
LAB_001e7df1:
          if (bVar20) {
            return (Status)(uintptr_t)this;
          }
          break;
        }
        pFVar4 = this_00->options_;
        pRVar17 = &(pFVar4->field_0)._impl_.edition_defaults_;
        pRVar18 = pRVar17;
        if ((*(byte *)((long)&pFVar4->field_0 + 0x30) & 1) != 0) {
          pRVar10 = internal::RepeatedPtrFieldBase::rep(&pRVar17->super_RepeatedPtrFieldBase);
          pRVar18 = (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)
                    pRVar10->elements;
        }
        if (((ulong)(pRVar17->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
          pRVar10 = internal::RepeatedPtrFieldBase::rep(&pRVar17->super_RepeatedPtrFieldBase);
          pRVar17 = (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)
                    pRVar10->elements;
        }
        ppvVar11 = &(pRVar17->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                   *(int *)((long)&pFVar4->field_0 + 0x38);
        if (pRVar18 == (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)ppvVar11)
        goto LAB_001e7dce;
        bVar7 = false;
        do {
          if (*(int *)((long)(pRVar18->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + 0x20) ==
              900) {
            bVar7 = true;
          }
          pRVar18 = (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)
                    &(pRVar18->super_RepeatedPtrFieldBase).current_size_;
        } while (pRVar18 !=
                 (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)ppvVar11);
        if (!bVar7) goto LAB_001e7dce;
        uVar3 = (this_00->options_->field_0)._impl_._has_bits_.has_bits_[0];
        puVar22 = (undefined1 *)(this_00->options_->field_0)._impl_.feature_support_;
        if (((FieldOptions_FeatureSupport *)puVar22 == (FieldOptions_FeatureSupport *)0x0 &
            (byte)uVar3 >> 1) == 1) goto LAB_001e7e4f;
        if ((uVar3 & 2) == 0) {
          pcVar14 = (this_00->all_names_).payload_;
          pcVar16 = (char *)(ulong)*(ushort *)(pcVar14 + 2);
          pcVar14 = pcVar14 + ~(ulong)pcVar16;
LAB_001e7a50:
          args_1_00._M_str = pcVar16;
          args_1_00._M_len = (size_t)"Feature field ";
          (anonymous_namespace)::
          Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                    ((char *)this,args_1_00,pcVar14);
        }
        else {
          if ((FieldOptions_FeatureSupport *)puVar22 == (FieldOptions_FeatureSupport *)0x0) {
            puVar22 = _FieldOptions_FeatureSupport_default_instance_;
          }
          pcVar14 = (this_00->all_names_).payload_;
          uVar2 = *(ushort *)(pcVar14 + 2);
          pcVar16 = (char *)(ulong)uVar2;
          pcVar14 = pcVar14 + ~(ulong)pcVar16;
          if ((undefined1  [32])
              ((undefined1  [32])((FieldOptions_FeatureSupport *)puVar22)->field_0 &
              (undefined1  [32])0x2) == (undefined1  [32])0x0) goto LAB_001e7a50;
          full_name_00._M_str._0_2_ = uVar2;
          full_name_00._M_len = (size_t)puVar22;
          full_name_00._M_str._2_6_ = 0;
          ValidateFeatureSupport((FeatureSupport *)this,full_name_00);
          if (*(long *)this == 1) {
            pFVar4 = this_00->options_;
            pRVar17 = &(pFVar4->field_0)._impl_.edition_defaults_;
            pRVar18 = pRVar17;
            if ((*(byte *)((long)&pFVar4->field_0 + 0x30) & 1) != 0) {
              pRVar10 = internal::RepeatedPtrFieldBase::rep(&pRVar17->super_RepeatedPtrFieldBase);
              pRVar18 = (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)
                        pRVar10->elements;
            }
            if (((ulong)(pRVar17->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
              pRVar10 = internal::RepeatedPtrFieldBase::rep(&pRVar17->super_RepeatedPtrFieldBase);
              pRVar17 = (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)
                        pRVar10->elements;
            }
            iVar8 = *(int *)((long)&pFVar4->field_0 + 0x38);
            for (; pRVar18 !=
                   (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)
                   (&(pRVar17->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar8);
                pRVar18 = (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)
                          &(pRVar18->super_RepeatedPtrFieldBase).current_size_) {
              uVar3 = *(uint *)((long)(pRVar18->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                               0x20);
              iVar9 = 5;
              if ((999 < (int)uVar3) &&
                 ((args_3 = 0x37b56b,
                  (int)uVar3 <
                  (((FieldOptions_FeatureSupport *)puVar22)->field_0)._impl_.edition_introduced_ ||
                  ((iVar9 = 0,
                   (undefined1  [32])
                   ((undefined1  [32])((FieldOptions_FeatureSupport *)puVar22)->field_0 &
                   (undefined1  [32])0x8) != (undefined1  [32])0x0 &&
                   (args_3 = 0x37b604,
                   (((FieldOptions_FeatureSupport *)puVar22)->field_0)._impl_.edition_removed_ <
                   (int)uVar3)))))) {
                pcVar14 = (this_00->all_names_).payload_;
                args_1_02._M_len = (ulong)*(ushort *)(pcVar14 + 2);
                args_1_02._M_str = pcVar14 + ~args_1_02._M_len;
                (anonymous_namespace)::
                Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*,google::protobuf::Edition,char_const*>
                          ((char *)this,args_1_02,(char *)(ulong)uVar3,args_3,in_R9);
                iVar9 = 1;
              }
              if ((iVar9 != 5) && (iVar9 != 0)) goto LAB_001e7a55;
            }
            *(undefined8 *)this = 1;
          }
        }
LAB_001e7a55:
        if (*(long *)this != 1) goto LAB_001e7df1;
        pEVar12 = FieldDescriptor::enum_type(this_00);
        if (pEVar12 != (EnumDescriptor *)0x0) {
          pEVar12 = FieldDescriptor::enum_type(this_00);
          if (pEVar12 == (EnumDescriptor *)0x0) {
            _GLOBAL__N_1::ValidateDescriptor((_GLOBAL__N_1 *)&local_60);
LAB_001e7e1d:
            _GLOBAL__N_1::ValidateDescriptor();
LAB_001e7e2a:
            internal::protobuf_assumption_failed
                      ("!value || _impl_.feature_support_ != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                       ,0x4c6f);
          }
          puVar22 = (undefined1 *)(this_00->options_->field_0)._impl_.feature_support_;
          if ((FieldOptions_FeatureSupport *)puVar22 == (FieldOptions_FeatureSupport *)0x0) {
            puVar22 = _FieldOptions_FeatureSupport_default_instance_;
          }
          pEVar12 = FieldDescriptor::enum_type(this_00);
          if (0 < pEVar12->value_count_) {
            lVar21 = 8;
            v1 = 0;
            do {
              pEVar12 = FieldDescriptor::enum_type(this_00);
              if (v1 < pEVar12->value_count_) {
                pcVar13 = (Nonnull<const_char_*>)0x0;
              }
              else {
                pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                    (v1,(long)pEVar12->value_count_,"index < value_count()");
              }
              if (pcVar13 != (Nonnull<const_char_*>)0x0) goto LAB_001e7e1d;
              pEVar5 = pEVar12->values_;
              uVar2 = *(ushort *)((this_00->all_names_).payload_ + 2);
              lVar6 = *(long *)((long)&pEVar5->type_ + lVar21);
              uVar3 = *(uint *)(lVar6 + 0x28);
              if (((uVar3 & 2) != 0) && (*(long *)(lVar6 + 0x50) == 0)) goto LAB_001e7e2a;
              if ((uVar3 & 2) == 0) {
                *(undefined8 *)this = 1;
              }
              else {
                FieldOptions_FeatureSupport::FieldOptions_FeatureSupport
                          (&local_60,(Arena *)0x0,(FieldOptions_FeatureSupport *)puVar22);
                from_msg = *(undefined1 **)(*(long *)((long)&pEVar5->type_ + lVar21) + 0x50);
                if ((MessageLite *)from_msg == (MessageLite *)0x0) {
                  from_msg = _FieldOptions_FeatureSupport_default_instance_;
                }
                FieldOptions_FeatureSupport::MergeImpl
                          ((MessageLite *)&local_60,(MessageLite *)from_msg);
                full_name._M_str =
                     *(char **)(*(long *)(&pEVar5->super_SymbolBaseN<0> + lVar21) + 0x28);
                full_name._M_len = (size_t)&local_60;
                ValidateFeatureSupport((FeatureSupport *)this,full_name);
                if (*(long *)this == 1) {
                  if ((int)local_60.field_0._16_4_ <
                      (((FieldOptions_FeatureSupport *)puVar22)->field_0)._impl_.edition_introduced_
                     ) {
                    pcVar14 = *(char **)(*(long *)(&pEVar5->super_SymbolBaseN<0> + lVar21) + 0x20);
                    pcVar16 = *(char **)(*(long *)(&pEVar5->super_SymbolBaseN<0> + lVar21) + 0x28);
                    pcVar19 = " was introduced before feature ";
                  }
                  else if ((((undefined1  [32])((FieldOptions_FeatureSupport *)puVar22)->field_0 &
                            (undefined1  [32])0x8) == (undefined1  [32])0x0) ||
                          (local_60.field_0._impl_.edition_removed_ <=
                           (((FieldOptions_FeatureSupport *)puVar22)->field_0)._impl_.
                           edition_removed_)) {
                    if ((((undefined1  [32])((FieldOptions_FeatureSupport *)puVar22)->field_0 &
                         (undefined1  [32])0x4) == (undefined1  [32])0x0) ||
                       (local_60.field_0._impl_.edition_deprecated_ <=
                        (((FieldOptions_FeatureSupport *)puVar22)->field_0)._impl_.
                        edition_deprecated_)) {
                      *(undefined8 *)this = 1;
                      goto LAB_001e7c34;
                    }
                    pcVar14 = *(char **)(*(long *)(&pEVar5->super_SymbolBaseN<0> + lVar21) + 0x20);
                    pcVar16 = *(char **)(*(long *)(&pEVar5->super_SymbolBaseN<0> + lVar21) + 0x28);
                    pcVar19 = " was deprecated after feature ";
                  }
                  else {
                    pcVar14 = *(char **)(*(long *)(&pEVar5->super_SymbolBaseN<0> + lVar21) + 0x20);
                    pcVar16 = *(char **)(*(long *)(&pEVar5->super_SymbolBaseN<0> + lVar21) + 0x28);
                    pcVar19 = " was removed after feature ";
                  }
                  args_1_01._M_str = pcVar16;
                  args_1_01._M_len = (size_t)"Feature value ";
                  args_3_00._M_str = " was.";
                  args_3_00._M_len = (size_t)pcVar19;
                  in_R9 = " was.";
                  (anonymous_namespace)::
                  Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                            ((char *)this,args_1_01,pcVar14,args_3_00,(char *)(ulong)uVar2);
                }
LAB_001e7c34:
                FieldOptions_FeatureSupport::~FieldOptions_FeatureSupport(&local_60);
              }
              if (*(long *)this != 1) goto LAB_001e7c82;
              v1 = v1 + 1;
              pEVar12 = FieldDescriptor::enum_type(this_00);
              lVar21 = lVar21 + 0x30;
            } while (v1 < pEVar12->value_count_);
          }
          *(undefined8 *)this = 1;
LAB_001e7c82:
          if (*(long *)this != 1) goto LAB_001e7df1;
        }
        lVar15 = lVar15 + 1;
        bVar20 = lVar15 < descriptor->field_count_;
      } while (lVar15 < descriptor->field_count_);
    }
    *(undefined8 *)this = 1;
  }
  else {
    pcVar14 = (descriptor->all_names_).payload_;
    uVar2 = *(ushort *)(pcVar14 + 2);
    args_1._M_str._0_2_ = uVar2;
    args_1._M_len = (size_t)"Type ";
    args_1._M_str._2_6_ = 0;
    (anonymous_namespace)::
    Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
              ((char *)this,args_1,pcVar14 + ~(ulong)uVar2);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ValidateDescriptor(const Descriptor& descriptor) {
  if (descriptor.oneof_decl_count() > 0) {
    return Error("Type ", descriptor.full_name(),
                 " contains unsupported oneof feature fields.");
  }
  for (int i = 0; i < descriptor.field_count(); ++i) {
    const FieldDescriptor& field = *descriptor.field(i);

    if (field.is_required()) {
      return Error("Feature field ", field.full_name(),
                   " is an unsupported required field.");
    }
    if (field.is_repeated()) {
      return Error("Feature field ", field.full_name(),
                   " is an unsupported repeated field.");
    }
    if (field.type() != FieldDescriptor::TYPE_ENUM &&
        field.type() != FieldDescriptor::TYPE_BOOL) {
      return Error("Feature field ", field.full_name(),
                   " is not an enum or boolean.");
    }
    if (field.options().targets().empty()) {
      return Error("Feature field ", field.full_name(),
                   " has no target specified.");
    }

    bool has_legacy_default = false;
    for (const auto& d : field.options().edition_defaults()) {
      if (d.edition() == Edition::EDITION_LEGACY) {
        has_legacy_default = true;
        continue;
      }
    }
    if (!has_legacy_default) {
      return Error("Feature field ", field.full_name(),
                   " has no default specified for EDITION_LEGACY, before it "
                   "was introduced.");
    }

    RETURN_IF_ERROR(ValidateFieldFeatureSupport(field));
    if (field.enum_type() != nullptr) {
      RETURN_IF_ERROR(ValidateValuesFeatureSupport(field));
    }
  }

  return absl::OkStatus();
}